

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O3

bool mognetwork::deleteAll(Data *elem)

{
  pointer pcVar1;
  
  if ((elem != (Data *)0x0) &&
     (pcVar1 = (elem->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start, pcVar1 != (pointer)0x0)) {
    operator_delete(pcVar1);
  }
  operator_delete(elem);
  return true;
}

Assistant:

bool deleteAll(TcpSocket::Data* elem) {delete elem; return true;}